

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  ImVec2 pos;
  ImRect avail_rect;
  ImVec2 size;
  ImVec2 local_60;
  ImVec2 local_58;
  float afStack_50 [2];
  char *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar4 = FindWindowByName(name);
  if ((pIVar4 == (ImGuiWindow *)0x0) || (pIVar4->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    uVar1 = *(undefined8 *)&viewport_p[3].WorkPos.y;
    uVar2 = *(undefined8 *)&viewport_p[3].WorkSize.y;
    fVar6 = (float)uVar1;
    local_58.x = (viewport_p->Pos).x + fVar6;
    fVar7 = (float)((ulong)uVar1 >> 0x20);
    local_58.y = (viewport_p->Pos).y + fVar7;
    fVar6 = ((viewport_p->Size).x - fVar6) + (float)uVar2;
    fVar7 = ((viewport_p->Size).y - fVar7) + (float)((ulong)uVar2 >> 0x20);
    afStack_50[0] = (float)(-(uint)(0.0 < fVar6) & (uint)fVar6) + local_58.x;
    afStack_50[1] = (float)(-(uint)(0.0 < fVar7) & (uint)fVar7) + local_58.y;
    local_60.y = local_58.y;
    local_60.x = local_58.x;
    uVar3 = dir & 0xfffffffe;
    if ((dir | 2U) == 3) {
      (&local_60.x)[uVar3 == 2] = afStack_50[uVar3 == 2] - axis_size;
    }
    bVar5 = uVar3 == 2;
    local_40.x = afStack_50[0] - local_58.x;
    local_40.y = afStack_50[1] - local_58.y;
    (&local_40.x)[bVar5] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_48 = name;
    SetNextWindowPos(&local_60,0,&local_38);
    SetNextWindowSize(&local_40,0);
    name = local_48;
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[3].WorkPos.y)[bVar5] = axis_size + (&viewport_p[3].WorkPos.y)[bVar5];
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[3].WorkSize.y)[bVar5] = (&viewport_p[3].WorkSize.y)[bVar5] - axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_58.x = 0.0;
  local_58.y = 0.0;
  PushStyleVar(5,&local_58);
  bVar5 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar5;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}